

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_protocol.cpp
# Opt level: O2

int WriteUserCmdMessage(usercmd_t *ucmd,usercmd_t *basis,BYTE **stream)

{
  int iVar1;
  
  if (basis == (usercmd_t *)0x0) {
    if ((((ucmd->buttons != 0) || (ucmd->pitch != 0)) || (ucmd->yaw != 0)) ||
       (((ucmd->forwardmove != 0 || (ucmd->sidemove != 0)) ||
        ((ucmd->upmove != 0 || (ucmd->roll != 0)))))) {
      **stream = '\x01';
      *stream = *stream + 1;
      basis = (usercmd_t *)0x0;
      goto LAB_0038e121;
    }
  }
  else if ((((ucmd->buttons != basis->buttons) || (ucmd->pitch != basis->pitch)) ||
           ((ucmd->yaw != basis->yaw ||
            (((ucmd->forwardmove != basis->forwardmove || (ucmd->sidemove != basis->sidemove)) ||
             (ucmd->upmove != basis->upmove)))))) || (ucmd->roll != basis->roll)) {
    **stream = '\x01';
    *stream = *stream + 1;
LAB_0038e121:
    iVar1 = PackUserCmd(ucmd,basis,stream);
    return iVar1 + 1;
  }
  **stream = '\x02';
  *stream = *stream + 1;
  return 1;
}

Assistant:

int WriteUserCmdMessage (usercmd_t *ucmd, const usercmd_t *basis, BYTE **stream)
{
	if (basis == NULL)
	{
		if (ucmd->buttons != 0 ||
			ucmd->pitch != 0 ||
			ucmd->yaw != 0 ||
			ucmd->forwardmove != 0 ||
			ucmd->sidemove != 0 ||
			ucmd->upmove != 0 ||
			ucmd->roll != 0)
		{
			WriteByte (DEM_USERCMD, stream);
			return PackUserCmd (ucmd, basis, stream) + 1;
		}
	}
	else
	if (ucmd->buttons != basis->buttons ||
		ucmd->pitch != basis->pitch ||
		ucmd->yaw != basis->yaw ||
		ucmd->forwardmove != basis->forwardmove ||
		ucmd->sidemove != basis->sidemove ||
		ucmd->upmove != basis->upmove ||
		ucmd->roll != basis->roll)
	{
		WriteByte (DEM_USERCMD, stream);
		return PackUserCmd (ucmd, basis, stream) + 1;
	}

	WriteByte (DEM_EMPTYUSERCMD, stream);
	return 1;
}